

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

Vec_Int_t * Str_ManCreateRoots(Vec_Wec_t *vGroups,int nObjs)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  ulong uVar6;
  long lVar7;
  
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < nObjs - 1U) {
    iVar4 = nObjs;
  }
  pVVar5->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = nObjs;
  }
  else {
    __s = (int *)malloc((long)iVar4 << 2);
    pVVar5->pArray = __s;
    pVVar5->nSize = nObjs;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)nObjs << 2);
      goto LAB_007e33cd;
    }
  }
  __s = (int *)0x0;
LAB_007e33cd:
  iVar4 = vGroups->nSize;
  if (0 < (long)iVar4) {
    pVVar2 = vGroups->pArray;
    uVar6 = 0;
    do {
      if (0 < pVVar2[uVar6].nSize) {
        piVar3 = pVVar2[uVar6].pArray;
        lVar7 = 0;
        do {
          iVar1 = piVar3[lVar7];
          if (((long)iVar1 < 0) || (nObjs <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          __s[iVar1] = (int)uVar6;
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar2[uVar6].nSize);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(long)iVar4);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Str_ManCreateRoots( Vec_Wec_t * vGroups, int nObjs )
{   // map tree MUXes into their classes
    Vec_Int_t * vRoots;
    Vec_Int_t * vGroup;
    int i, k, Entry;
    vRoots = Vec_IntStartFull( nObjs );
    Vec_WecForEachLevel( vGroups, vGroup, i )
        Vec_IntForEachEntry( vGroup, Entry, k )
            Vec_IntWriteEntry( vRoots, Entry, i );
    return vRoots;
}